

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPHashAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPHashAlgorithm::hashUpdate(OSSLEVPHashAlgorithm *this,ByteString *data)

{
  EVP_MD_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *d;
  ByteString *in_RSI;
  HashAlgorithm *in_RDI;
  ByteString dummy;
  ByteString *in_stack_ffffffffffffff88;
  ByteString local_40;
  byte local_1;
  
  bVar1 = HashAlgorithm::hashUpdate(in_RDI,in_RSI);
  if (bVar1) {
    sVar3 = ByteString::size((ByteString *)0x131baa);
    if (sVar3 == 0) {
      local_1 = 1;
    }
    else {
      ctx = (EVP_MD_CTX *)in_RDI[1]._vptr_HashAlgorithm;
      d = ByteString::const_byte_str(in_stack_ffffffffffffff88);
      sVar3 = ByteString::size((ByteString *)0x131be1);
      iVar2 = EVP_DigestUpdate(ctx,d,sVar3);
      if (iVar2 == 0) {
        softHSMLog(3,"hashUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
                   ,0x5c,"EVP_DigestUpdate failed");
        EVP_MD_CTX_free(in_RDI[1]._vptr_HashAlgorithm);
        in_RDI[1]._vptr_HashAlgorithm = (_func_int **)0x0;
        ByteString::ByteString((ByteString *)0x131c4c);
        HashAlgorithm::hashFinal(in_RDI,&local_40);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x131c6c);
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPHashAlgorithm::hashUpdate(const ByteString& data)
{
	if (!HashAlgorithm::hashUpdate(data))
	{
		return false;
	}

	// Continue digesting
	if (data.size() == 0)
	{
		return true;
	}

	if (!EVP_DigestUpdate(curCTX, (unsigned char*) data.const_byte_str(), data.size()))
	{
		ERROR_MSG("EVP_DigestUpdate failed");

		EVP_MD_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		HashAlgorithm::hashFinal(dummy);

		return false;
	}

	return true;
}